

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  u32 *puVar4;
  sqlite3_file *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  u32 uVar10;
  u32 uVar11;
  u32 uVar12;
  int iVar13;
  long lVar14;
  u8 *aFrame;
  int iVar15;
  int iVar16;
  int i;
  uint uVar17;
  u32 ***local_a0;
  u32 local_94;
  i64 szWal;
  u8 *local_88;
  u32 pgno;
  undefined8 local_78;
  undefined8 uStack_70;
  void *pDummy;
  u8 aBuf [32];
  
  if (5 < cnt) {
    if (100 < (uint)cnt) {
      return 0xf;
    }
    iVar16 = (cnt + -9) * (cnt + -9) * 0x27;
    if ((uint)cnt < 10) {
      iVar16 = 1;
    }
    (*pWal->pVfs->xSleep)(pWal->pVfs,iVar16);
  }
  if (useWal == 0) {
    if (pWal->bShmUnreliable == '\0') {
      iVar16 = walIndexReadHdr(pWal,pChanged);
      if (iVar16 != 0) {
        if (iVar16 != 5) {
          return iVar16;
        }
        if (*pWal->apWiData == (u32 *)0x0) {
          return -1;
        }
        iVar16 = walLockShared(pWal,2);
        if (iVar16 == 0) {
          walUnlockShared(pWal,2);
          return -1;
        }
        iVar13 = 0x105;
        goto LAB_0015c69f;
      }
      if (pWal->bShmUnreliable == '\0') {
        puVar4 = *pWal->apWiData;
        iVar16 = 0;
        if (puVar4[0x18] == (pWal->hdr).mxFrame) {
          iVar16 = walLockShared(pWal,3);
          walShmBarrier(pWal);
          if (iVar16 != 5) {
            if (iVar16 != 0) {
              return iVar16;
            }
            iVar16 = bcmp(*pWal->apWiData,&pWal->hdr,0x30);
            if (iVar16 == 0) {
              pWal->readLock = 0;
              return 0;
            }
            iVar13 = 3;
            goto LAB_0015c6ee;
          }
        }
        goto LAB_0015c5e3;
      }
    }
    iVar16 = walLockShared(pWal,3);
    if (iVar16 == 0) {
      pWal->readLock = 0;
      iVar13 = (*pWal->pDbFd->pMethods->xShmMap)(pWal->pDbFd,0,0x8000,0,&pDummy);
      if (iVar13 != 8) {
        if (iVar13 == 0x508) {
          psVar5 = pWal->pWalFd;
          puVar4 = *pWal->apWiData;
          uVar10 = puVar4[1];
          uVar6 = *(undefined8 *)(puVar4 + 2);
          uVar11 = puVar4[4];
          uVar12 = puVar4[5];
          uVar7 = *(undefined8 *)(puVar4 + 6);
          uVar8 = *(undefined8 *)(puVar4 + 8);
          uVar9 = *(undefined8 *)(puVar4 + 10);
          (pWal->hdr).iVersion = puVar4[0];
          (pWal->hdr).unused = uVar10;
          (pWal->hdr).iChange = (int)uVar6;
          (pWal->hdr).isInit = (char)((ulong)uVar6 >> 0x20);
          (pWal->hdr).bigEndCksum = (char)((ulong)uVar6 >> 0x28);
          (pWal->hdr).szPage = (short)((ulong)uVar6 >> 0x30);
          (pWal->hdr).mxFrame = uVar11;
          (pWal->hdr).nPage = uVar12;
          *(undefined8 *)(pWal->hdr).aFrameCksum = uVar7;
          *(undefined8 *)(pWal->hdr).aSalt = uVar8;
          *(undefined8 *)(pWal->hdr).aCksum = uVar9;
          iVar13 = (*psVar5->pMethods->xFileSize)(psVar5,&szWal);
          if (iVar13 == 0) {
            if (szWal < 0x20) {
              *pChanged = 1;
              aFrame = (u8 *)0x0;
              iVar13 = -(uint)((pWal->hdr).mxFrame != 0);
              goto LAB_0015c7f9;
            }
            iVar13 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aBuf,0x20,0);
            if (iVar13 == 0) {
              if (*(long *)(pWal->hdr).aSalt != aBuf._16_8_) {
                aFrame = (u8 *)0x0;
                iVar13 = -1;
                goto LAB_0015c7f9;
              }
              iVar16 = pWal->szPage + 0x18;
              aFrame = (u8 *)sqlite3_malloc64((long)iVar16);
              if (aFrame != (u8 *)0x0) {
                local_88 = aFrame + 0x18;
                local_78 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                uStack_70 = 0;
                lVar14 = (ulong)(pWal->szPage + 0x18) * (ulong)(pWal->hdr).mxFrame + 0x20;
                do {
                  lVar1 = lVar14 + iVar16;
                  if (szWal < lVar1) {
LAB_0015c9ee:
                    iVar13 = 0;
                    break;
                  }
                  iVar13 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,iVar16,lVar14);
                  if (iVar13 != 0) break;
                  iVar13 = walDecodeFrame(pWal,&pgno,&local_94,local_88,aFrame);
                  if (iVar13 == 0) goto LAB_0015c9ee;
                  lVar14 = lVar1;
                  iVar13 = -1;
                } while (local_94 == 0);
                *(undefined8 *)(pWal->hdr).aFrameCksum = local_78;
                goto LAB_0015c7f9;
              }
              iVar13 = 7;
              goto LAB_0015c676;
            }
          }
        }
        aFrame = (u8 *)0x0;
        goto LAB_0015c7f9;
      }
      iVar13 = -1;
    }
    else {
      iVar13 = -1;
      if (iVar16 != 5) {
        iVar13 = iVar16;
      }
    }
LAB_0015c676:
    aFrame = (u8 *)0x0;
LAB_0015c7f9:
    sqlite3_free(aFrame);
    if (iVar13 != 0) {
      for (lVar14 = 0; lVar14 < pWal->nWiData; lVar14 = lVar14 + 1) {
        sqlite3_free(pWal->apWiData[lVar14]);
        pWal->apWiData[lVar14] = (u32 *)0x0;
      }
      pWal->bShmUnreliable = '\0';
      sqlite3WalEndReadTransaction(pWal);
      *pChanged = 1;
    }
    return iVar13;
  }
  puVar4 = *pWal->apWiData;
  iVar16 = 0;
LAB_0015c5e3:
  local_a0 = &pWal->apWiData;
  uVar2 = (pWal->hdr).mxFrame;
  iVar15 = 0;
  uVar17 = 0;
  for (lVar14 = 2; lVar14 != 6; lVar14 = lVar14 + 1) {
    uVar3 = (puVar4 + 0x18)[lVar14];
    if (uVar3 <= uVar2 && uVar17 <= uVar3) {
      iVar15 = (int)lVar14 + -1;
      uVar17 = uVar3;
    }
  }
  if ((pWal->readOnly & 2) == 0) {
    if ((uVar17 < uVar2) || (iVar15 == 0)) {
      for (lVar14 = 0; iVar13 = (int)lVar14, iVar13 != 4; lVar14 = lVar14 + 1) {
        iVar16 = walLockExclusive(pWal,iVar13 + 4,1);
        if (iVar16 != 5) {
          if (iVar16 != 0) {
            return iVar16;
          }
          puVar4[lVar14 + 0x1a] = uVar2;
          walUnlockExclusive(pWal,iVar13 + 4,1);
          iVar15 = iVar13 + 1;
          uVar17 = uVar2;
          goto LAB_0015c686;
        }
        iVar16 = 5;
      }
      goto LAB_0015c67e;
    }
  }
  else {
LAB_0015c67e:
    if (iVar15 == 0) {
      return -(uint)(iVar16 == 5) | 0x508;
    }
  }
LAB_0015c686:
  iVar13 = iVar15 + 3;
  iVar16 = walLockShared(pWal,iVar13);
  if (iVar16 == 0) {
    pWal->minFrame = puVar4[0x18] + 1;
    walShmBarrier(pWal);
    if ((puVar4[(long)iVar15 + 0x19] == uVar17) &&
       (iVar16 = bcmp(**local_a0,&pWal->hdr,0x30), iVar16 == 0)) {
      pWal->readLock = (i16)iVar15;
      return 0;
    }
LAB_0015c6ee:
    walUnlockShared(pWal,iVar13);
    return -1;
  }
  iVar13 = -1;
LAB_0015c69f:
  if (iVar16 != 5) {
    return iVar16;
  }
  return iVar13;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */
  u32 mxFrame;                    /* Wal frame to lock to */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* useWal may only be set for read/write connections */
  assert( (pWal->readOnly & WAL_SHM_RDONLY)==0 || useWal==0 );

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve,
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer,
  ** so that on the 100th (and last) RETRY we delay for 323 milliseconds.
  ** The total delay time before giving up is less than 10 seconds.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*(cnt-9)*39;
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    assert( rc==SQLITE_OK );
    if( pWal->bShmUnreliable==0 ){
      rc = walIndexReadHdr(pWal, pChanged);
    }
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS
        ** modules may return SQLITE_BUSY due to a race condition in the
        ** code that determines whether or not the shared-memory region
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    else if( pWal->bShmUnreliable ){
      return walBeginShmUnreliable(pWal, pChanged);
    }
  }

  assert( pWal->nWiData>0 );
  assert( pWal->apWiData[0]!=0 );
  pInfo = walCkptInfo(pWal);
  if( !useWal && AtomicLoad(&pInfo->nBackfill)==pWal->hdr.mxFrame
#ifdef SQLITE_ENABLE_SNAPSHOT
   && (pWal->pSnapshot==0 || pWal->hdr.mxFrame==0)
#endif
  ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshot. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  mxFrame = pWal->hdr.mxFrame;
#ifdef SQLITE_ENABLE_SNAPSHOT
  if( pWal->pSnapshot && pWal->pSnapshot->mxFrame<mxFrame ){
    mxFrame = pWal->pSnapshot->mxFrame;
  }
#endif
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = AtomicLoad(pInfo->aReadMark+i);
    if( mxReadMark<=thisMark && thisMark<=mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  if( (pWal->readOnly & WAL_SHM_RDONLY)==0
   && (mxReadMark<mxFrame || mxI==0)
  ){
    for(i=1; i<WAL_NREADER; i++){
      rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
      if( rc==SQLITE_OK ){
        AtomicStore(pInfo->aReadMark+i,mxFrame);
        mxReadMark = mxFrame;
        mxI = i;
        walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
        break;
      }else if( rc!=SQLITE_BUSY ){
        return rc;
      }
    }
  }
  if( mxI==0 ){
    assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
    return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTINIT;
  }

  rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
  if( rc ){
    return rc==SQLITE_BUSY ? WAL_RETRY : rc;
  }
  /* Now that the read-lock has been obtained, check that neither the
  ** value in the aReadMark[] array or the contents of the wal-index
  ** header have changed.
  **
  ** It is necessary to check that the wal-index header did not change
  ** between the time it was read and when the shared-lock was obtained
  ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
  ** that the log file may have been wrapped by a writer, or that frames
  ** that occur later in the log than pWal->hdr.mxFrame may have been
  ** copied into the database by a checkpointer. If either of these things
  ** happened, then reading the database with the current value of
  ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
  ** instead.
  **
  ** Before checking that the live wal-index header has not changed
  ** since it was read, set Wal.minFrame to the first frame in the wal
  ** file that has not yet been checkpointed. This client will not need
  ** to read any frames earlier than minFrame from the wal file - they
  ** can be safely read directly from the database file.
  **
  ** Because a ShmBarrier() call is made between taking the copy of
  ** nBackfill and checking that the wal-header in shared-memory still
  ** matches the one cached in pWal->hdr, it is guaranteed that the
  ** checkpointer that set nBackfill was not working with a wal-index
  ** header newer than that cached in pWal->hdr. If it were, that could
  ** cause a problem. The checkpointer could omit to checkpoint
  ** a version of page X that lies before pWal->minFrame (call that version
  ** A) on the basis that there is a newer version (version B) of the same
  ** page later in the wal file. But if version B happens to like past
  ** frame pWal->hdr.mxFrame - then the client would incorrectly assume
  ** that it can read version A from the database file. However, since
  ** we can guarantee that the checkpointer that set nBackfill could not
  ** see any pages past pWal->hdr.mxFrame, this problem does not come up.
  */
  pWal->minFrame = AtomicLoad(&pInfo->nBackfill)+1;
  walShmBarrier(pWal);
  if( AtomicLoad(pInfo->aReadMark+mxI)!=mxReadMark
   || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
  ){
    walUnlockShared(pWal, WAL_READ_LOCK(mxI));
    return WAL_RETRY;
  }else{
    assert( mxReadMark<=pWal->hdr.mxFrame );
    pWal->readLock = (i16)mxI;
  }
  return rc;
}